

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entities.c
# Opt level: O1

xmlChar * xmlEncodeEntitiesInternal(xmlDocPtr doc,xmlChar *input,uint flags)

{
  xmlChar *pxVar1;
  
  if (input == (xmlChar *)0x0) {
    return (xmlChar *)0x0;
  }
  if (doc != (xmlDocPtr)0x0) {
    if (doc->type == XML_HTML_DOCUMENT_NODE) {
      flags = flags | 4;
      goto LAB_0012dde1;
    }
    if (doc->encoding != (xmlChar *)0x0) goto LAB_0012dde1;
  }
  flags = flags | 2;
LAB_0012dde1:
  pxVar1 = xmlEscapeText(input,flags);
  return pxVar1;
}

Assistant:

xmlChar *
xmlEncodeEntitiesInternal(xmlDocPtr doc, const xmlChar *input,
                          unsigned flags) {
    if (input == NULL)
        return(NULL);

    if ((doc != NULL) && (doc->type == XML_HTML_DOCUMENT_NODE))
        flags |= XML_ESCAPE_HTML;
    else if ((doc == NULL) || (doc->encoding == NULL))
        flags |= XML_ESCAPE_NON_ASCII;

    return(xmlEscapeText(input, flags));
}